

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O3

void CompareOnTheFlyNodeAnim(comparer_context *comp)

{
  pointer pcVar1;
  string local_440;
  undefined1 local_420 [1032];
  
  comparer_context::push_elem(comp,"aiNodeAnim");
  local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"mNodeName","");
  comparer_context::cmp<aiString>((aiString *)local_420,comp,&local_440);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440._M_dataplus._M_p != &local_440.field_2) {
    operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
  }
  pcVar1 = local_420 + 0x10;
  local_420._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_420,"mNumPositionKeys","");
  comparer_context::cmp<unsigned_int>(comp,(string *)local_420);
  if ((pointer)local_420._0_8_ != pcVar1) {
    operator_delete((void *)local_420._0_8_,local_420._16_8_ + 1);
  }
  local_420._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_420,"mNumRotationKeys","");
  comparer_context::cmp<unsigned_int>(comp,(string *)local_420);
  if ((pointer)local_420._0_8_ != pcVar1) {
    operator_delete((void *)local_420._0_8_,local_420._16_8_ + 1);
  }
  local_420._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_420,"mNumScalingKeys","");
  comparer_context::cmp<unsigned_int>(comp,(string *)local_420);
  if ((pointer)local_420._0_8_ != pcVar1) {
    operator_delete((void *)local_420._0_8_,local_420._16_8_ + 1);
  }
  local_420._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_420,"mPreState","");
  comparer_context::cmp<unsigned_int>(comp,(string *)local_420);
  if ((pointer)local_420._0_8_ != pcVar1) {
    operator_delete((void *)local_420._0_8_,local_420._16_8_ + 1);
  }
  local_420._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_420,"mPostState","");
  comparer_context::cmp<unsigned_int>(comp,(string *)local_420);
  if ((pointer)local_420._0_8_ != pcVar1) {
    operator_delete((void *)local_420._0_8_,local_420._16_8_ + 1);
  }
  local_420._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_420,"mPositionKeys","");
  comparer_context::cmp_bounds<aiVectorKey>(comp,(string *)local_420);
  if ((pointer)local_420._0_8_ != pcVar1) {
    operator_delete((void *)local_420._0_8_,local_420._16_8_ + 1);
  }
  local_420._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_420,"mRotationKeys","");
  comparer_context::cmp_bounds<aiQuatKey>(comp,(string *)local_420);
  if ((pointer)local_420._0_8_ != pcVar1) {
    operator_delete((void *)local_420._0_8_,local_420._16_8_ + 1);
  }
  local_420._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_420,"mScalingKeys","");
  comparer_context::cmp_bounds<aiVectorKey>(comp,(string *)local_420);
  if ((pointer)local_420._0_8_ != pcVar1) {
    operator_delete((void *)local_420._0_8_,local_420._16_8_ + 1);
  }
  comparer_context::pop_elem(comp);
  return;
}

Assistant:

void CompareOnTheFlyNodeAnim(comparer_context& comp)    {
    scoped_chunk chunk(comp,"aiNodeAnim");

    comp.cmp<aiString>("mNodeName");
    comp.cmp<uint32_t>("mNumPositionKeys");
    comp.cmp<uint32_t>("mNumRotationKeys");
    comp.cmp<uint32_t>("mNumScalingKeys");
    comp.cmp<uint32_t>("mPreState");
    comp.cmp<uint32_t>("mPostState");

    comp.cmp_bounds<aiVectorKey>("mPositionKeys");
    comp.cmp_bounds<aiQuatKey>("mRotationKeys");
    comp.cmp_bounds<aiVectorKey>("mScalingKeys");
}